

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O3

void __thiscall
FFTAnalyzer::AnalyzeInput
          (FFTAnalyzer *this,float *data,int numchannels,int numsamples,float decaySpeed)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  UnityComplexNumber *pUVar4;
  float *pfVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  
  CheckInitialized(this);
  uVar2 = this->spectrumSize;
  if (0 < (int)(uVar2 - numsamples)) {
    pfVar3 = this->ibuffer;
    uVar7 = 0;
    do {
      pfVar3[uVar7] = pfVar3[(long)numsamples + uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar2 - numsamples != uVar7);
  }
  if (0 < numsamples) {
    pfVar3 = this->ibuffer;
    uVar7 = (ulong)(uint)numsamples;
    iVar6 = uVar2 - numsamples;
    do {
      pfVar3[iVar6] = *data;
      data = data + numchannels;
      iVar6 = iVar6 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  pUVar4 = this->cspec;
  if (0 < (int)uVar2) {
    pfVar3 = this->window;
    pfVar5 = this->ibuffer;
    uVar7 = 0;
    do {
      pUVar4[uVar7].re = pfVar5[uVar7] * pfVar3[uVar7];
      pUVar4[uVar7].im = 0.0;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  FFTProcess<double>(pUVar4,uVar2,true);
  uVar2 = this->spectrumSize;
  if (1 < (int)uVar2) {
    pUVar4 = this->cspec;
    pfVar3 = this->ispec1;
    pfVar5 = this->ispec2;
    uVar7 = 0;
    do {
      fVar9 = pUVar4[uVar7].re;
      fVar1 = pUVar4[uVar7].im;
      fVar9 = SQRT(fVar9 * fVar9 + fVar1 * fVar1);
      uVar8 = -(uint)(pfVar5[uVar7] < fVar9);
      pfVar3[uVar7] = (float)(~uVar8 & (uint)(pfVar5[uVar7] * decaySpeed) | (uint)fVar9 & uVar8);
      uVar7 = uVar7 + 1;
    } while (uVar2 >> 1 != uVar7);
  }
  return;
}

Assistant:

void FFTAnalyzer::AnalyzeInput(float* data, int numchannels, int numsamples, float decaySpeed)
{
    CheckInitialized();

    for (int n = 0; n < spectrumSize - numsamples; n++)
        ibuffer[n] = ibuffer[n + numsamples];
    for (int n = 0; n < numsamples; n++)
        ibuffer[n + spectrumSize - numsamples] = data[n * numchannels];
    for (int n = 0; n < spectrumSize; n++)
        cspec[n].Set(ibuffer[n] * window[n], 0.0f);
    Forward(cspec, spectrumSize, true);
    for (int n = 0; n < spectrumSize / 2; n++)
    {
        float a = cspec[n].Magnitude();
        ispec1[n] = (a > ispec2[n]) ? a : ispec2[n] * decaySpeed;
    }
}